

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metamakefile.cpp
# Opt level: O0

ssize_t __thiscall
BuildsMetaMakefileGenerator::write
          (BuildsMetaMakefileGenerator *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  QFlags<QIODeviceBase::OpenModeFlag> QVar4;
  int iVar5;
  MakefileGenerator *pMVar6;
  qsizetype qVar7;
  reference ppBVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  bool using_stdout;
  Build *build;
  int i;
  QString *output_name;
  bool ret;
  Build *glue;
  QString build_name;
  undefined4 in_stack_fffffffffffffdc8;
  FileHandleFlag in_stack_fffffffffffffdcc;
  char *in_stack_fffffffffffffdd0;
  FILE *in_stack_fffffffffffffdd8;
  QMakeProject *in_stack_fffffffffffffde0;
  undefined6 in_stack_fffffffffffffde8;
  byte in_stack_fffffffffffffdee;
  undefined1 in_stack_fffffffffffffdef;
  BuildsMetaMakefileGenerator *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 uVar10;
  bool local_1de;
  BuildsMetaMakefileGenerator *this_00;
  int local_1c4;
  byte local_1b1;
  BuildsMetaMakefileGenerator *this_01;
  QMakeProject *proj;
  byte local_199;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  char *local_40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (BuildsMetaMakefileGenerator *)0x0;
  proj = (QMakeProject *)this;
  bVar1 = QList<BuildsMetaMakefileGenerator::Build_*>::isEmpty
                    ((QList<BuildsMetaMakefileGenerator::Build_*> *)0x1d5cb6);
  if (!bVar1) {
    QList<BuildsMetaMakefileGenerator::Build_*>::first
              ((QList<BuildsMetaMakefileGenerator::Build_*> *)in_stack_fffffffffffffdd0);
    bVar1 = QString::isNull((QString *)0x1d5cd8);
    if ((!bVar1) && (Option::qmake_mode != QMAKE_GENERATE_PRL)) {
      this_01 = (BuildsMetaMakefileGenerator *)operator_new(0x38);
      Build::Build((Build *)in_stack_fffffffffffffdd0);
      QString::operator=((QString *)this_01,(QString *)&(this->super_MetaMakefileGenerator).name);
      pMVar6 = MetaMakefileGenerator::createMakefileGenerator(proj,SUB81((ulong)this_01 >> 0x38,0));
      *(MakefileGenerator **)&this_01->init_flag = pMVar6;
      QList<BuildsMetaMakefileGenerator::Build_*>::operator+=
                ((QList<BuildsMetaMakefileGenerator::Build_*> *)in_stack_fffffffffffffdd0,
                 (parameter_type)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    }
  }
  local_1b1 = 1;
  QFile::fileName();
  local_1c4 = 0;
  while( true ) {
    uVar10 = false;
    if (local_1b1 != 0) {
      qVar7 = QList<BuildsMetaMakefileGenerator::Build_*>::size(&this->makefiles);
      uVar10 = local_1c4 < qVar7;
    }
    if ((bool)uVar10 == false) break;
    QFile::setFileName((QString *)Option::output);
    ppBVar8 = QList<BuildsMetaMakefileGenerator::Build_*>::operator[]
                        ((QList<BuildsMetaMakefileGenerator::Build_*> *)in_stack_fffffffffffffdd0,
                         CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    this_00 = (BuildsMetaMakefileGenerator *)*ppBVar8;
    bVar1 = false;
    if (((*(MakefileGenerator **)&this_00->init_flag == (MakefileGenerator *)0x0) ||
        ((Option::qmake_mode != QMAKE_GENERATE_MAKEFILE &&
         (Option::qmake_mode != QMAKE_GENERATE_PROJECT)))) ||
       ((uVar3 = (*((*(MakefileGenerator **)&this_00->init_flag)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo[0x1d])(), (uVar3 & 1) != 0 &&
        ((uVar3 = (*((*(MakefileGenerator **)&this_00->init_flag)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo[0x1d])(), (uVar3 & 1) == 0 ||
         ((this_01 != (BuildsMetaMakefileGenerator *)0x0 && (this_00 != this_01)))))))) {
      bVar1 = true;
    }
    else {
      uVar9 = QIODevice::isOpen();
      if ((uVar9 & 1) == 0) {
        QFile::fileName();
        local_40 = "-";
        bVar2 = ::operator==((QString *)in_stack_fffffffffffffdd0,
                             (char **)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8))
        ;
        QString::~QString((QString *)0x1d5eec);
        if (bVar2) {
          QString::QString((QString *)in_stack_fffffffffffffdd8,
                           (char *)CONCAT17(uVar10,in_stack_fffffffffffffe08));
          QFile::setFileName((QString *)Option::output);
          QString::~QString((QString *)0x1d5f2e);
          qmake_getpwd();
          QString::operator=((QString *)in_stack_fffffffffffffdd0,
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
          QString::~QString((QString *)0x1d5f5c);
          in_stack_fffffffffffffdf0 = _stdout;
          QVar4 = operator|((enum_type)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                            (enum_type)in_stack_fffffffffffffdd0);
          QFlags<QFileDevice::FileHandleFlag>::QFlags
                    ((QFlags<QFileDevice::FileHandleFlag> *)in_stack_fffffffffffffdd0,
                     in_stack_fffffffffffffdcc);
          uVar9 = QFile::open((_IO_FILE *)Option::output,
                              (QFlags_conflict *)in_stack_fffffffffffffdf0,
                              (QFlags_conflict *)
                              (ulong)(uint)QVar4.
                                           super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>
                                           .super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
          if ((uVar9 & 1) == 0) {
            fprintf(_stderr,"Failure to open stdout\n");
            local_199 = 0;
            goto LAB_001d63f4;
          }
          bVar1 = true;
        }
        else {
          QFile::fileName();
          bVar2 = QString::isEmpty((QString *)0x1d6005);
          in_stack_fffffffffffffdee = bVar2 && Option::qmake_mode == QMAKE_GENERATE_MAKEFILE;
          in_stack_fffffffffffffdef = in_stack_fffffffffffffdee;
          QString::~QString((QString *)0x1d603a);
          if ((in_stack_fffffffffffffdee & 1) != 0) {
            in_stack_fffffffffffffde0 = (this->super_MetaMakefileGenerator).project;
            ProKey::ProKey((ProKey *)in_stack_fffffffffffffdd0,
                           (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
            QMakeEvaluator::first
                      ((QMakeEvaluator *)
                       CONCAT17(in_stack_fffffffffffffdef,
                                CONCAT16(in_stack_fffffffffffffdee,in_stack_fffffffffffffde8)),
                       (ProKey *)in_stack_fffffffffffffde0);
            ProString::toQString
                      ((ProString *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
            QFile::setFileName((QString *)Option::output);
            QString::~QString((QString *)0x1d60b9);
            ProString::~ProString((ProString *)0x1d60c6);
            ProKey::~ProKey((ProKey *)0x1d60d3);
          }
          local_120 = 0xaaaaaaaaaaaaaaaa;
          local_118 = 0xaaaaaaaaaaaaaaaa;
          local_110 = 0xaaaaaaaaaaaaaaaa;
          QString::QString((QString *)in_stack_fffffffffffffdd0,
                           (QString *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8))
          ;
          bVar2 = QString::isEmpty((QString *)0x1d6120);
          if (!bVar2) {
            bVar2 = QString::isEmpty((QString *)0x1d6131);
            if (!bVar2) {
              QString::operator+=((QString *)in_stack_fffffffffffffdd0,
                                  (char *)CONCAT17(in_stack_fffffffffffffdef,
                                                   CONCAT16(in_stack_fffffffffffffdee,
                                                            in_stack_fffffffffffffde8)));
            }
            QString::operator+=((QString *)in_stack_fffffffffffffdd0,
                                (QString *)
                                CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
          }
          uVar3 = (*((*(MakefileGenerator **)&this_00->init_flag)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo[0x1f])
                            (*(MakefileGenerator **)&this_00->init_flag,Option::output,&local_120);
          if ((uVar3 & 1) == 0) {
            in_stack_fffffffffffffdd8 = _stderr;
            QFile::fileName();
            local_1de = QString::isEmpty((QString *)0x1d61b8);
            if (local_1de) {
              in_stack_fffffffffffffdd0 = "(stdout)";
            }
            else {
              QFile::fileName();
              QString::toLatin1((QString *)
                                CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
              in_stack_fffffffffffffdd0 = QByteArray::constData((QByteArray *)0x1d6216);
            }
            local_1de = !local_1de;
            fprintf(in_stack_fffffffffffffdd8,"Failure to open file: %s\n",in_stack_fffffffffffffdd0
                   );
            if (local_1de) {
              QByteArray::~QByteArray((QByteArray *)0x1d6249);
              QString::~QString((QString *)0x1d625f);
            }
            QString::~QString((QString *)0x1d626c);
            local_199 = 0;
            bVar2 = true;
          }
          else {
            bVar2 = false;
          }
          QString::~QString((QString *)0x1d6293);
          if (bVar2) goto LAB_001d63f4;
        }
      }
    }
    if (*(long *)&this_00->init_flag == 0) {
      local_1b1 = 0;
    }
    else if (this_00 == this_01) {
      checkForConflictingTargets(this_00);
      ProKey::ProKey((ProKey *)in_stack_fffffffffffffdd0,
                     (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      accumulateVariableFromBuilds
                (in_stack_fffffffffffffdf0,
                 (ProKey *)
                 CONCAT17(in_stack_fffffffffffffdef,
                          CONCAT16(in_stack_fffffffffffffdee,in_stack_fffffffffffffde8)),
                 (Build *)in_stack_fffffffffffffde0);
      ProKey::~ProKey((ProKey *)0x1d6316);
      local_1b1 = (**(code **)(**(long **)&this_00->init_flag + 0xd8))();
      local_1b1 = local_1b1 & 1;
    }
    else {
      local_1b1 = (**(code **)(**(long **)&this_00->init_flag + 0xd0))();
      local_1b1 = local_1b1 & 1;
      if ((this_01 != (BuildsMetaMakefileGenerator *)0x0) &&
         (uVar3 = (*((*(MakefileGenerator **)&this_01->init_flag)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo[0x1d])(), (uVar3 & 1) != 0)) {
        iVar5 = (*((*(MakefileGenerator **)&this_01->init_flag)->super_QMakeSourceFileInfo).
                  _vptr_QMakeSourceFileInfo[0x1e])
                          (*(MakefileGenerator **)&this_01->init_flag,
                           *(undefined8 *)&this_00->init_flag);
        local_1b1 = (byte)iVar5 & 1;
      }
    }
    if ((!bVar1) && (QFileDevice::close(), local_1b1 == 0)) {
      QFile::remove();
    }
    local_1c4 = local_1c4 + 1;
  }
  local_199 = local_1b1;
LAB_001d63f4:
  QString::~QString((QString *)0x1d6401);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_199) & 0xffffffffffffff01
  ;
}

Assistant:

bool
BuildsMetaMakefileGenerator::write()
{
    Build *glue = nullptr;
    if(!makefiles.isEmpty() && !makefiles.first()->build.isNull()
        && Option::qmake_mode != Option::QMAKE_GENERATE_PRL) {
        glue = new Build;
        glue->name = name;
        glue->makefile = createMakefileGenerator(project, true);
        makefiles += glue;
    }

    bool ret = true;
    const QString &output_name = Option::output.fileName();
    for(int i = 0; ret && i < makefiles.size(); i++) {
        Option::output.setFileName(output_name);
        Build *build = makefiles[i];

        bool using_stdout = false;
        if(build->makefile && (Option::qmake_mode == Option::QMAKE_GENERATE_MAKEFILE ||
                               Option::qmake_mode == Option::QMAKE_GENERATE_PROJECT)
           && (!build->makefile->supportsMergedBuilds()
            || (build->makefile->supportsMergedBuilds() && (!glue || build == glue)))) {
            //open output
            if(!(Option::output.isOpen())) {
                if(Option::output.fileName() == "-") {
                    Option::output.setFileName("");
                    Option::output_dir = qmake_getpwd();
                    if (!Option::output.open(stdout, QIODevice::WriteOnly | QIODevice::Text)) {
                        fprintf(stderr, "Failure to open stdout\n");
                        return false;
                    }
                    using_stdout = true;
                } else {
                    if(Option::output.fileName().isEmpty() &&
                       Option::qmake_mode == Option::QMAKE_GENERATE_MAKEFILE)
                        Option::output.setFileName(project->first("QMAKE_MAKEFILE").toQString());
                    QString build_name = build->name;
                    if(!build->build.isEmpty()) {
                        if(!build_name.isEmpty())
                            build_name += ".";
                        build_name += build->build;
                    }
                    if(!build->makefile->openOutput(Option::output, build_name)) {
                        fprintf(stderr, "Failure to open file: %s\n",
                                Option::output.fileName().isEmpty() ? "(stdout)" :
                                Option::output.fileName().toLatin1().constData());
                        return false;
                    }
                }
            }
        } else {
           using_stdout = true; //kind of..
        }

        if(!build->makefile) {
            ret = false;
        } else if(build == glue) {
            checkForConflictingTargets();
            accumulateVariableFromBuilds("QMAKE_INTERNAL_INCLUDED_FILES", build);
            ret = build->makefile->writeProjectMakefile();
        } else {
            ret = build->makefile->write();
            if (glue && glue->makefile->supportsMergedBuilds())
                ret = glue->makefile->mergeBuildProject(build->makefile);
        }
        if(!using_stdout) {
            Option::output.close();
            if(!ret)
                Option::output.remove();
        }
    }
    return ret;
}